

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moneystr.cpp
# Opt level: O1

optional<long> ParseMoney(string *money_string)

{
  char *pcVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  byte bVar4;
  void *pvVar5;
  size_type sVar6;
  long lVar7;
  undefined8 uVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  size_type __pos;
  byte *unaff_R13;
  _Storage<long,_true> unaff_R14;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  string_view str_00;
  optional<long> oVar14;
  string strWhole;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (money_string->_M_dataplus)._M_p;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)money_string->_M_string_length;
  bVar13 = paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
  if ((!bVar13) && (*pcVar2 != '\0')) {
    pbVar9 = (byte *)0x1;
    do {
      bVar13 = paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)pbVar9;
      if (bVar13) break;
      pcVar1 = pcVar2 + (long)pbVar9;
      pbVar9 = pbVar9 + 1;
    } while (*pcVar1 != '\0');
  }
  if (bVar13) {
    pbVar9 = (byte *)0xffffffffffffffff;
    local_78._M_dataplus._M_p = (pointer)paVar3;
    local_78._M_string_length = (size_type)pcVar2;
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      unaff_R13 = (byte *)0x0;
      do {
        pvVar5 = memchr(" \f\n\r\t\v",(int)pcVar2[(long)unaff_R13],6);
        pbVar9 = unaff_R13;
        if (pvVar5 == (void *)0x0) break;
        unaff_R13 = unaff_R13 + 1;
        pbVar9 = (byte *)0xffffffffffffffff;
      } while (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)unaff_R13);
    }
    if (pbVar9 == (byte *)0xffffffffffffffff) {
      uVar10 = 0;
      pbVar9 = (byte *)0x0;
    }
    else {
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_78," \f\n\r\t\v"
                         ,0xffffffffffffffff,6);
      if (local_78._M_dataplus._M_p < pbVar9) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar8 = std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",pbVar9);
          if ((byte *)local_78._M_dataplus._M_p != unaff_R13) {
            operator_delete(local_78._M_dataplus._M_p,
                            CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                     local_78.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58 != paVar3) {
            operator_delete(local_58,local_48[0] + 1);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar8);
          }
        }
        goto LAB_0076e5ce;
      }
      uVar10 = (sVar6 - (long)pbVar9) + 1;
      if ((ulong)((long)local_78._M_dataplus._M_p - (long)pbVar9) < uVar10) {
        uVar10 = (long)local_78._M_dataplus._M_p - (long)pbVar9;
      }
      pbVar9 = pbVar9 + local_78._M_string_length;
    }
    unaff_R14._M_value = (long)&local_58;
    local_58 = (byte *)local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)unaff_R14._M_value,pbVar9,pbVar9 + uVar10);
    if (local_50 != 0) {
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      pbVar9 = local_58;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      do {
        pbVar11 = pbVar9 + 1;
        bVar4 = *pbVar9;
        if (bVar4 < 0x20) {
          uVar10 = 0;
          if (bVar4 - 9 < 5) goto LAB_0076e4c1;
          if (bVar4 == 0) {
LAB_0076e4b6:
            pbVar11 = pbVar9;
            uVar12 = 0;
            goto LAB_0076e4b9;
          }
        }
        else {
          uVar10 = 0;
          if (bVar4 == 0x20) goto LAB_0076e4c1;
          if (bVar4 == 0x2e) {
            bVar4 = *pbVar11;
            pbVar9 = pbVar11;
            if (9 < (byte)(bVar4 - 0x30)) goto LAB_0076e4b6;
            uVar12 = 0;
            uVar10 = 10000000;
            goto LAB_0076e47d;
          }
        }
        if (9 < (byte)(bVar4 - 0x30)) goto LAB_0076e4bf;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux(&local_78,local_78._M_string_length,0,1,bVar4);
        pbVar9 = pbVar11;
      } while( true );
    }
    uVar10 = 0;
    goto LAB_0076e4d7;
  }
  uVar10 = 0;
  goto LAB_0076e4ee;
  while (bVar13 = 9 < uVar10, uVar10 = uVar10 / 10, bVar13) {
LAB_0076e47d:
    uVar12 = ((ulong)bVar4 - 0x30) * uVar10 + uVar12;
    bVar4 = pbVar11[1];
    pbVar11 = pbVar11 + 1;
    if (9 < (byte)(bVar4 - 0x30)) break;
  }
LAB_0076e4b9:
  if (*pbVar11 == 0) {
    uVar10 = 0;
    if ((local_78._M_string_length < (char *)0xb) && (uVar12 < 0x5f5e101)) {
      str_00._M_str = local_78._M_dataplus._M_p;
      str_00._M_len = local_78._M_string_length;
      lVar7 = LocaleIndependentAtoi<long>(str_00);
      unaff_R14._M_value = lVar7 * 100000000 + uVar12;
      uVar10 = (ulong)((ulong)unaff_R14 < 0x775f05a074001);
    }
  }
  else {
LAB_0076e4bf:
    uVar10 = 0;
  }
LAB_0076e4c1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
LAB_0076e4d7:
  if (local_58 != (byte *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
LAB_0076e4ee:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = uVar10;
    oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = unaff_R14._M_value;
    return (optional<long>)
           oVar14.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
LAB_0076e5ce:
  __stack_chk_fail();
}

Assistant:

std::optional<CAmount> ParseMoney(const std::string& money_string)
{
    if (!ContainsNoNUL(money_string)) {
        return std::nullopt;
    }
    const std::string str = TrimString(money_string);
    if (str.empty()) {
        return std::nullopt;
    }

    std::string strWhole;
    int64_t nUnits = 0;
    const char* p = str.c_str();
    for (; *p; p++)
    {
        if (*p == '.')
        {
            p++;
            int64_t nMult = COIN / 10;
            while (IsDigit(*p) && (nMult > 0))
            {
                nUnits += nMult * (*p++ - '0');
                nMult /= 10;
            }
            break;
        }
        if (IsSpace(*p))
            return std::nullopt;
        if (!IsDigit(*p))
            return std::nullopt;
        strWhole.insert(strWhole.end(), *p);
    }
    if (*p) {
        return std::nullopt;
    }
    if (strWhole.size() > 10) // guard against 63 bit overflow
        return std::nullopt;
    if (nUnits < 0 || nUnits > COIN)
        return std::nullopt;
    int64_t nWhole = LocaleIndependentAtoi<int64_t>(strWhole);
    CAmount value = nWhole * COIN + nUnits;

    if (!MoneyRange(value)) {
        return std::nullopt;
    }

    return value;
}